

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O1

void ArgmaxTask::run(search *sch,multi_ex *ec)

{
  float *pfVar1;
  float fVar2;
  pointer ppeVar3;
  stringstream *psVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  uint32_t oracle;
  ptag local_38;
  float local_34;
  
  ppeVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  fVar8 = 1.4013e-45;
  fVar9 = 1.4013e-45;
  lVar5 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppeVar3;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    lVar6 = 0;
    do {
      fVar2 = (float)(ppeVar3[lVar6]->l).multi.label;
      if ((uint)fVar9 < (uint)fVar2) {
        fVar9 = fVar2;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  pfVar1 = (float *)sch->task_data;
  local_38 = 0;
  ppeVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar3) {
    fVar8 = 1.4013e-45;
    uVar7 = 0;
    do {
      local_34 = fVar9;
      if (*(char *)(pfVar1 + 2) == '\0') {
        local_34 = (ppeVar3[uVar7]->l).simple.label;
      }
      fVar2 = (float)Search::search::predict
                               (sch,ppeVar3[uVar7],(int)uVar7 + 1,(action *)&local_34,1,&local_38,
                                "p",(action *)0x0,0,(float *)0x0,0,0.0);
      if ((uint)fVar8 < (uint)fVar2) {
        fVar8 = fVar2;
      }
      local_38 = local_38 + 1;
      uVar7 = (ulong)local_38;
      ppeVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3));
  }
  if ((uint)fVar8 < (uint)fVar9) {
    fVar2 = *pfVar1 / pfVar1[1];
  }
  else {
    fVar2 = 0.0;
    if ((uint)fVar9 < (uint)fVar8) {
      fVar2 = 1.0;
    }
  }
  Search::search::loss(sch,fVar2);
  psVar4 = Search::search::output_abi_cxx11_(sch);
  if (*(int *)(psVar4 + *(long *)(*(long *)psVar4 + -0x18) + 0x20) == 0) {
    psVar4 = Search::search::output_abi_cxx11_(sch);
    std::ostream::_M_insert<unsigned_long>((ulong)(psVar4 + 0x10));
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  uint32_t max_prediction = 1;
  uint32_t max_label = 1;

  for (size_t i = 0; i < ec.size(); i++) max_label = max(ec[i]->l.multi.label, max_label);

  for (ptag i = 0; i < ec.size(); i++)
  {
    // labels should be 1 or 2, and our output is MAX of all predicted values
    uint32_t oracle = D.predict_max ? max_label : ec[i]->l.multi.label;
    uint32_t prediction = sch.predict(*ec[i], i + 1, &oracle, 1, &i, "p");

    max_prediction = max(prediction, max_prediction);
  }
  float loss = 0.;
  if (max_label > max_prediction)
    loss = D.false_negative_cost / D.negative_weight;
  else if (max_prediction > max_label)
    loss = 1.;
  sch.loss(loss);

  if (sch.output().good())
    sch.output() << max_prediction;
}